

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::XYZVisitor::XYZVisitor(XYZVisitor *this,SimInfo *info,string *script)

{
  SelectionEvaluator *this_00;
  SelectionSet local_40;
  
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__XYZVisitor_002882c8;
  this->info = (SimInfo *)0x0;
  SelectionManager::SelectionManager(&this->seleMan,info);
  this_00 = &this->evaluator;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  (this->frame).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frame).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frame).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->doPositions_ = true;
  this->doVelocities_ = false;
  this->doForces_ = false;
  this->doVectors_ = false;
  this->doCharges_ = false;
  this->doElectricFields_ = false;
  this->doGlobalIDs_ = false;
  this->info = info;
  std::__cxx11::string::assign((char *)&(this->super_BaseVisitor).visitorName);
  SelectionEvaluator::loadScriptString(this_00,script);
  if ((this->evaluator).isDynamic_ == false) {
    SelectionEvaluator::evaluate(&local_40,this_00);
    SelectionManager::setSelectionSet(&this->seleMan,&local_40);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_40.bitsets_);
  }
  return;
}

Assistant:

XYZVisitor::XYZVisitor(SimInfo* info, const std::string& script) :
      BaseVisitor(), seleMan(info), evaluator(info), doPositions_(true),
      doVelocities_(false), doForces_(false), doVectors_(false),
      doCharges_(false), doElectricFields_(false), doGlobalIDs_(false) {
    this->info  = info;
    visitorName = "XYZVisitor";

    evaluator.loadScriptString(script);

    if (!evaluator.isDynamic()) {
      seleMan.setSelectionSet(evaluator.evaluate());
    }
  }